

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bindTest.cpp
# Opt level: O1

bool blc::network::isPortFree(int port)

{
  int __fd;
  int iVar1;
  sockaddr_in addr;
  sockaddr local_20;
  
  __fd = socket(2,1,0);
  local_20.sa_family = 2;
  local_20.sa_data._0_2_ = (ushort)port << 8 | (ushort)port >> 8;
  local_20.sa_data[2] = '\0';
  local_20.sa_data[3] = '\0';
  local_20.sa_data[4] = '\0';
  local_20.sa_data[5] = '\0';
  iVar1 = bind(__fd,&local_20,0x10);
  close(__fd);
  return iVar1 != -1;
}

Assistant:

bool blc::network::isPortFree(int port) {
	struct ::sockaddr_in addr;
		int sock = socket(PF_INET, SOCK_STREAM, 0);
		addr.sin_family = AF_INET;
		addr.sin_port = htons(port);
		addr.sin_addr.s_addr = htonl(INADDR_ANY);
		if (::bind(sock, (const struct sockaddr *)&addr, sizeof(struct sockaddr_in)) == -1) {
			close(sock);
			return (false);
		}
		close(sock);
		return (true);
}